

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheGL.cpp
# Opt level: O2

size_t Diligent::ShaderResourceCacheGL::GetRequiredMemorySize(TResourceCount *ResCount)

{
  ulong uVar1;
  string msg;
  
  uVar1 = (ulong)ResCount->_M_elems[3] * 0x10 +
          ((ulong)ResCount->_M_elems[2] +
          (ulong)ResCount->_M_elems[1] + (ulong)ResCount->_M_elems[0]) * 0x18;
  if (0xfffe < uVar1) {
    FormatString<char[45]>(&msg,(char (*) [45])"Memory size exceed the maximum allowed size.");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetRequiredMemorySize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
               ,0x31);
    std::__cxx11::string::~string((string *)&msg);
  }
  return uVar1;
}

Assistant:

size_t ShaderResourceCacheGL::GetRequiredMemorySize(const TResourceCount& ResCount)
{
    static_assert(std::is_same<TResourceCount, PipelineResourceSignatureGLImpl::TBindings>::value,
                  "ShaderResourceCacheGL::TResourceCount must be the same type as PipelineResourceSignatureGLImpl::TBindings");
    // clang-format off
    auto MemSize =
                sizeof(CachedUB)           * ResCount[BINDING_RANGE_UNIFORM_BUFFER] +
                sizeof(CachedResourceView) * ResCount[BINDING_RANGE_TEXTURE]        +
                sizeof(CachedResourceView) * ResCount[BINDING_RANGE_IMAGE]          +
                sizeof(CachedSSBO)         * ResCount[BINDING_RANGE_STORAGE_BUFFER];
    // clang-format on
    VERIFY(MemSize < InvalidResourceOffset, "Memory size exceed the maximum allowed size.");
    return MemSize;
}